

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BlobCompare(Mem *pB1,Mem *pB2)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = pB1->n;
  iVar3 = pB2->n;
  uVar1 = pB1->flags;
  if (((pB2->flags | uVar1) >> 10 & 1) == 0) {
    iVar2 = iVar3;
    if (iVar4 < iVar3) {
      iVar2 = iVar4;
    }
    iVar2 = memcmp(pB1->z,pB2->z,(long)iVar2);
    if (iVar2 == 0) {
      return iVar4 - iVar3;
    }
    return iVar2;
  }
  if ((uVar1 & 0x400 & pB2->flags) == 0) {
    if ((uVar1 & 0x400) != 0) {
      iVar4 = isAllZero(pB2->z,iVar3);
      if (iVar4 == 0) {
        return -1;
      }
      return (pB1->u).nZero - iVar3;
    }
    iVar3 = isAllZero(pB1->z,iVar4);
    if (iVar3 == 0) {
      return 1;
    }
  }
  else {
    iVar4 = (pB1->u).nZero;
  }
  return iVar4 - (pB2->u).nZero;
}

Assistant:

int sqlite3BlobCompare(const Mem *pB1, const Mem *pB2){
  int c;
  int n1 = pB1->n;
  int n2 = pB2->n;

  /* It is possible to have a Blob value that has some non-zero content
  ** followed by zero content.  But that only comes up for Blobs formed
  ** by the OP_MakeRecord opcode, and such Blobs never get passed into
  ** sqlite3MemCompare(). */
  assert( (pB1->flags & MEM_Zero)==0 || n1==0 );
  assert( (pB2->flags & MEM_Zero)==0 || n2==0 );

  if( (pB1->flags|pB2->flags) & MEM_Zero ){
    if( pB1->flags & pB2->flags & MEM_Zero ){
      return pB1->u.nZero - pB2->u.nZero;
    }else if( pB1->flags & MEM_Zero ){
      if( !isAllZero(pB2->z, pB2->n) ) return -1;
      return pB1->u.nZero - n2;
    }else{
      if( !isAllZero(pB1->z, pB1->n) ) return +1;
      return n1 - pB2->u.nZero;
    }
  }
  c = memcmp(pB1->z, pB2->z, n1>n2 ? n2 : n1);
  if( c ) return c;
  return n1 - n2;
}